

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

ngram_class_t *
ngram_class_new(ngram_model_t *model,int32 tag_wid,int32 start_wid,glist_t classwords)

{
  gnode_s **ppgVar1;
  int32 iVar2;
  int iVar3;
  ngram_class_t *pnVar4;
  int32 *piVar5;
  gnode_s *pgVar6;
  long lVar7;
  float fVar8;
  double dVar9;
  
  pnVar4 = (ngram_class_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                          ,0x2ad);
  pnVar4->tag_wid = tag_wid;
  pnVar4->start_wid = start_wid;
  iVar2 = glist_count(classwords);
  pnVar4->n_words = iVar2;
  piVar5 = (int32 *)__ckd_calloc__((long)iVar2,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                   ,0x2b2);
  pnVar4->prob1 = piVar5;
  pnVar4->nword_hash = (ngram_hash_s *)0x0;
  pnVar4->n_hash = 0;
  if (classwords == (glist_t)0x0) {
    dVar9 = 0.0;
  }
  else {
    fVar8 = 0.0;
    pgVar6 = classwords;
    do {
      fVar8 = fVar8 + (float)(pgVar6->data).fl;
      pgVar6 = pgVar6->next;
    } while (pgVar6 != (gnode_s *)0x0);
    dVar9 = (double)fVar8;
  }
  if ((1.1 < dVar9) || (dVar9 < 0.9)) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x2ba,"Total class probability is %f, will normalize\n");
    pgVar6 = classwords;
    if (classwords == (glist_t)0x0) {
      return pnVar4;
    }
    do {
      (pgVar6->data).fl = (pgVar6->data).fl / dVar9;
      ppgVar1 = &pgVar6->next;
      pgVar6 = *ppgVar1;
    } while (*ppgVar1 != (gnode_s *)0x0);
  }
  if (classwords != (glist_t)0x0) {
    lVar7 = 0;
    do {
      iVar3 = logmath_log(model->lmath,(float64)(double)(float)(classwords->data).fl);
      *(int *)((long)pnVar4->prob1 + lVar7) = iVar3;
      classwords = classwords->next;
      lVar7 = lVar7 + 4;
    } while (classwords != (gnode_s *)0x0);
  }
  return pnVar4;
}

Assistant:

ngram_class_t *
ngram_class_new(ngram_model_t * model, int32 tag_wid, int32 start_wid,
                glist_t classwords)
{
    ngram_class_t *lmclass;
    gnode_t *gn;
    float32 tprob;
    int i;

    lmclass = ckd_calloc(1, sizeof(*lmclass));
    lmclass->tag_wid = tag_wid;
    /* wid_base is the wid (minus class tag) of the first word in the list. */
    lmclass->start_wid = start_wid;
    lmclass->n_words = glist_count(classwords);
    lmclass->prob1 = ckd_calloc(lmclass->n_words, sizeof(*lmclass->prob1));
    lmclass->nword_hash = NULL;
    lmclass->n_hash = 0;
    tprob = 0.0;
    for (gn = classwords; gn; gn = gnode_next(gn)) {
        tprob += gnode_float32(gn);
    }
    if (tprob > 1.1 || tprob < 0.9) {
        E_INFO("Total class probability is %f, will normalize\n", tprob);
        for (gn = classwords; gn; gn = gnode_next(gn)) {
            gn->data.fl /= tprob;
        }
    }
    for (i = 0, gn = classwords; gn; ++i, gn = gnode_next(gn)) {
        lmclass->prob1[i] = logmath_log(model->lmath, gnode_float32(gn));
    }

    return lmclass;
}